

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O1

bool Js::JavascriptOperators::CanShortcutInstanceOnUnknownPropertyName(RecyclableObject *instance)

{
  TypeId typeId;
  bool bVar1;
  int iVar2;
  BOOL BVar3;
  DynamicTypeHandler *pDVar4;
  JavascriptFunction *pJVar5;
  
  bVar1 = Phases::IsEnabled((Phases *)&DAT_015bbe90,OptUnknownElementNamePhase);
  if (!bVar1) {
    typeId = ((instance->type).ptr)->typeId;
    if (typeId == TypeIds_HostDispatch) {
      return false;
    }
    if (typeId == TypeIds_Proxy) {
      return false;
    }
    bVar1 = DynamicType::Is(typeId);
    if (bVar1) {
      pDVar4 = DynamicObject::GetTypeHandler((DynamicObject *)instance);
      iVar2 = (*pDVar4->_vptr_DynamicTypeHandler[2])(pDVar4);
      if (iVar2 != 0) {
        return false;
      }
    }
    BVar3 = RecyclableObject::IsExternal(instance);
    if ((BVar3 == 0) &&
       (iVar2 = (*(instance->super_FinalizableObject).super_IRecyclerVisitedObject.
                  _vptr_IRecyclerVisitedObject[0x5a])(instance), iVar2 == 0)) {
      bVar1 = VarIsImpl<Js::JavascriptFunction>(instance);
      if (bVar1) {
        pJVar5 = UnsafeVarTo<Js::JavascriptFunction,Js::RecyclableObject>(instance);
      }
      else {
        pJVar5 = (JavascriptFunction *)0x0;
      }
      if (pJVar5 != (JavascriptFunction *)0x0) {
        iVar2 = (*(pJVar5->super_DynamicObject).super_RecyclableObject.super_FinalizableObject.
                  super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x6e])();
        return iVar2 != 0;
      }
    }
  }
  return false;
}

Assistant:

bool JavascriptOperators::CanShortcutInstanceOnUnknownPropertyName(RecyclableObject *instance)
    {
        if (PHASE_OFF1(Js::OptUnknownElementNamePhase))
        {
            return false;
        }

        TypeId typeId = instance->GetTypeId();
        if (typeId == TypeIds_Proxy || typeId == TypeIds_HostDispatch)
        {
            return false;
        }
        if (DynamicType::Is(typeId) &&
            static_cast<DynamicObject*>(instance)->GetTypeHandler()->IsStringTypeHandler())
        {
            return false;
        }
        if (instance->IsExternal())
        {
            return false;
        }

        if (!(instance->HasDeferredTypeHandler()))
        {
            JavascriptFunction * function = JavascriptOperators::TryFromVar<JavascriptFunction>(instance);
            return function && function->IsExternalFunction();
        }
        return false;
    }